

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

bool spvOpcodeIsBlockTerminator(Op opcode)

{
  bool bVar1;
  
  if (opcode - OpBranch < 3) {
    return true;
  }
  bVar1 = spvOpcodeIsReturnOrAbort(opcode);
  return bVar1;
}

Assistant:

bool spvOpcodeIsBranch(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpBranch:
    case spv::Op::OpBranchConditional:
    case spv::Op::OpSwitch:
      return true;
    default:
      return false;
  }
}